

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O1

bool __thiscall DOMTest::testUtilFunctions(DOMTest *this)

{
  short *psVar1;
  short *psVar2;
  uchar *puVar3;
  uchar *puVar4;
  char *pcVar5;
  char *pcVar6;
  wchar16 wVar7;
  wchar16 wVar8;
  char cVar9;
  char cVar10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  XMLSize_t XVar14;
  XMLSize_t XVar15;
  uchar *puVar16;
  size_t sVar17;
  wchar16 *pwVar18;
  wchar16 *pwVar19;
  char *pcVar20;
  long lVar21;
  CMStateSet setT2;
  XMLCh uval [2];
  XMLCh aval [2];
  XMLCh two [3];
  XMLCh one [2];
  char *uc;
  char *ac;
  char *empty;
  CMStateSetEnumerator enumT;
  char *bytes2;
  char *bytes;
  char *uc4;
  XMLCh *uc2;
  XMLCh *ac2;
  XMLCh *empty2;
  XMLCh uc3 [2];
  CMStateSetEnumerator enumT2;
  CMStateSet setT4;
  CMStateSet setT3;
  CMStateSetEnumerator enumT2c;
  CMStateSetEnumerator enumT2b;
  CMStateSetEnumerator enumT2a;
  XMLCh xmlStr [7];
  XMLCh xmlStr2 [12];
  XMLCh buffer [100];
  TranscodeToStr aTStack_2a8 [16];
  undefined8 local_298;
  CMStateSet local_288;
  wchar16 local_264 [4];
  short local_25c [4];
  short local_254 [2];
  uchar *local_250;
  uchar *local_248;
  uchar *local_240;
  CMStateSetEnumerator local_238;
  CMStateSet local_220;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  wchar16 *local_1e8;
  wchar16 *local_1e0;
  wchar16 *local_1d8;
  wchar16 local_1cc [2];
  CMStateSetEnumerator local_1c8;
  CMStateSet local_1b0;
  CMStateSet local_190;
  CMStateSetEnumerator local_170;
  CMStateSetEnumerator local_158;
  CMStateSetEnumerator local_140;
  wchar16 local_128 [8];
  wchar16 local_118 [16];
  wchar16 local_f8 [104];
  
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar9 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if (cVar9 == '\0') {
    testUtilFunctions();
  }
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if (cVar10 != '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if (cVar10 != '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSReplaced(tempStr);
  if (cVar10 != '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            (" x yz ",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" x yz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011b9e0;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011b9e0:
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011ba2f;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011ba2f:
  xercesc_4_0::XMLString::transcode
            (" x yz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011ba7e;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011ba7e:
  xercesc_4_0::XMLString::transcode
            ("\rx yz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::replaceWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bacd;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bacd:
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar10 != '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar10 != '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar10 != '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar10 != '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar10 == '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar10 == '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            ("x  yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::isWSCollapsed(tempStr);
  if (cVar10 != '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bc7d;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bc7d:
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bccc;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bccc:
  xercesc_4_0::XMLString::transcode
            ("x  yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bd1b;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bd1b:
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bd82;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bd82:
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bdd1;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bdd1:
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011be20;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011be20:
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::collapseWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011be6f;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011be6f:
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            (" x\tyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bed6;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bed6:
  xercesc_4_0::XMLString::transcode
            ("x yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bf25;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bf25:
  xercesc_4_0::XMLString::transcode
            ("x  yz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bf74;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bf74:
  xercesc_4_0::XMLString::transcode
            (" xyz ",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011bfc3;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011bfc3:
  xercesc_4_0::XMLString::transcode
            (" xyz\n",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011c012;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011c012:
  xercesc_4_0::XMLString::transcode
            ("\rxyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011c061;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011c061:
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::removeWS(tempStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    if (*psVar1 == 0) {
      if (*(short *)((long)tempStr2 + lVar21) == 0) goto LAB_0011c0b0;
      break;
    }
    psVar2 = (short *)((long)tempStr2 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 == *psVar2);
  testUtilFunctions();
  cVar9 = '\0';
LAB_0011c0b0:
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)&xercesc_4_0::XMLUni::fgZeroLenString + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 != 0);
  if (lVar21 != 2) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  local_254[0] = 0x41;
  local_254[1] = 0;
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)local_254 + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 != 0);
  if (lVar21 != 4) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  local_25c[2] = 0;
  local_25c[0] = 0x41;
  local_25c[1] = 0x42;
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)local_25c + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 != 0);
  if (lVar21 != 6) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            ("xyz",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar10 = xercesc_4_0::XMLString::copyNString(local_f8,tempStr,100);
  if (cVar10 == '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  cVar10 = xercesc_4_0::XMLString::copyNString(local_f8,tempStr,3);
  if (cVar10 == '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  cVar10 = xercesc_4_0::XMLString::copyNString(local_f8,tempStr,2);
  if (cVar10 != '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  cVar10 = xercesc_4_0::XMLString::copyNString(local_f8,tempStr,4);
  if (cVar10 == '\0') {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            ("1234567890",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  iVar12 = xercesc_4_0::XMLString::indexOf(tempStr,L'1');
  if (iVar12 != 0) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  iVar12 = xercesc_4_0::XMLString::indexOf(tempStr,L'5');
  if (iVar12 != 4) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  iVar12 = xercesc_4_0::XMLString::indexOf(tempStr,L'0');
  if (iVar12 != 9) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  iVar12 = xercesc_4_0::XMLString::indexOf(tempStr,L'A');
  if (iVar12 != -1) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::XMLString::transcode
            ("1234567890",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 != 0);
  iVar12 = xercesc_4_0::XMLString::lastIndexOf(L'1',tempStr,(lVar21 >> 1) - 1);
  if (iVar12 != 0) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 != 0);
  iVar12 = xercesc_4_0::XMLString::lastIndexOf(L'5',tempStr,(lVar21 >> 1) - 1);
  if (iVar12 != 4) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 != 0);
  iVar12 = xercesc_4_0::XMLString::lastIndexOf(L'0',tempStr,(lVar21 >> 1) - 1);
  if (iVar12 != 9) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  lVar21 = 0;
  do {
    psVar1 = (short *)((long)tempStr + lVar21);
    lVar21 = lVar21 + 2;
  } while (*psVar1 != 0);
  iVar12 = xercesc_4_0::XMLString::lastIndexOf(L'A',tempStr,(lVar21 >> 1) - 1);
  if (iVar12 != -1) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  local_220.fBitCount = 0x3c;
  local_220.fBits[0] = 0;
  local_220.fBits[1] = 0;
  local_220.fBits[2] = 0;
  local_220.fBits[3] = 0;
  local_220.fDynamicBuffer = (CMDynamicBuffer *)0x0;
  xercesc_4_0::CMStateSet::setBit(&local_220,8);
  xercesc_4_0::CMStateSet::setBit(&local_220,0x34);
  xercesc_4_0::CMStateSet::setBit(&local_220,0x22);
  bVar11 = xercesc_4_0::CMStateSet::getBit(&local_220,8);
  if (((!bVar11) || (bVar11 = xercesc_4_0::CMStateSet::getBit(&local_220,0x34), !bVar11)) ||
     (bVar11 = xercesc_4_0::CMStateSet::getBit(&local_220,0x22), !bVar11)) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&local_238,&local_220,0);
  if ((local_238.fLastValue == 0) ||
     (uVar13 = xercesc_4_0::CMStateSetEnumerator::nextElement(&local_238), uVar13 != 8)) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  if ((local_238.fLastValue == 0) ||
     (uVar13 = xercesc_4_0::CMStateSetEnumerator::nextElement(&local_238), uVar13 != 0x22)) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  if ((local_238.fLastValue == 0) ||
     (uVar13 = xercesc_4_0::CMStateSetEnumerator::nextElement(&local_238), uVar13 != 0x34)) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  if (local_238.fLastValue != 0) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::CMStateSet::CMStateSet
            (&local_288,0xc00,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::setBit(&local_288,0);
  xercesc_4_0::CMStateSet::setBit(&local_288,0x1ff);
  xercesc_4_0::CMStateSet::setBit(&local_288,0x200);
  xercesc_4_0::CMStateSet::setBit(&local_288,0x201);
  xercesc_4_0::CMStateSet::setBit(&local_288,0x3ff);
  xercesc_4_0::CMStateSet::setBit(&local_288,0x800);
  xercesc_4_0::CMStateSet::setBit(&local_288,0x9ff);
  xercesc_4_0::CMStateSet::setBit(&local_288,0xa00);
  xercesc_4_0::CMStateSet::setBit(&local_288,0xa01);
  xercesc_4_0::CMStateSet::setBit(&local_288,0xbff);
  bVar11 = xercesc_4_0::CMStateSet::getBit(&local_288,0);
  if (((!bVar11) || (bVar11 = xercesc_4_0::CMStateSet::getBit(&local_288,0x3ff), !bVar11)) ||
     (bVar11 = xercesc_4_0::CMStateSet::getBit(&local_288,0xa01), !bVar11)) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  XVar14 = xercesc_4_0::CMStateSet::getBitCountInRange(&local_288,0,0xc00);
  if (XVar14 != 10) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&local_1c8,&local_288,0);
  if (local_1c8.fLastValue == 0) {
LAB_0011cc09:
    testUtilFunctions();
    cVar9 = '\0';
  }
  else {
    lVar21 = 10;
    do {
      xercesc_4_0::CMStateSetEnumerator::nextElement(&local_1c8);
      lVar21 = lVar21 + -1;
    } while (local_1c8.fLastValue != 0);
    if (lVar21 != 0) goto LAB_0011cc09;
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&local_140,&local_288,0x200);
  if ((local_140.fLastValue == 0) ||
     (uVar13 = xercesc_4_0::CMStateSetEnumerator::nextElement(&local_140), uVar13 != 0x200)) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&local_158,&local_288,0x202);
  if ((local_158.fLastValue == 0) ||
     (uVar13 = xercesc_4_0::CMStateSetEnumerator::nextElement(&local_158), uVar13 != 0x3ff)) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::CMStateSetEnumerator::CMStateSetEnumerator(&local_170,&local_288,0x800);
  if ((local_170.fLastValue == 0) ||
     (uVar13 = xercesc_4_0::CMStateSetEnumerator::nextElement(&local_170), uVar13 != 0x800)) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::CMStateSet::CMStateSet
            (&local_190,0xc00,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::CMStateSet
            (&local_1b0,0xc00,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::setBit(&local_190,0);
  xercesc_4_0::CMStateSet::setBit(&local_1b0,0x400);
  XVar14 = xercesc_4_0::CMStateSet::hashCode(&local_190);
  XVar15 = xercesc_4_0::CMStateSet::hashCode(&local_1b0);
  if (XVar14 == XVar15) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (aTStack_2a8,(wchar16 *)&xercesc_4_0::XMLUni::fgZeroLenString,"UTF-8",
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_298 = 0;
  puVar16 = (uchar *)xercesc_4_0::ArrayJanitor<unsigned_char>::release();
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(aTStack_2a8);
  local_240 = puVar16;
  lVar21 = xercesc_4_0::XMLString::stringLen((char *)puVar16);
  if (lVar21 != 0) {
    testUtilFunctions();
    cVar9 = '\0';
  }
  puVar16 = local_240;
  sVar17 = strlen((char *)local_240);
  xercesc_4_0::TranscodeFromStr::TranscodeFromStr
            ((TranscodeFromStr *)aTStack_2a8,puVar16,sVar17,"UTF-8",
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_298 = 0;
  pwVar18 = (wchar16 *)xercesc_4_0::ArrayJanitor<char16_t>::release();
  xercesc_4_0::TranscodeFromStr::~TranscodeFromStr((TranscodeFromStr *)aTStack_2a8);
  local_1d8 = pwVar18;
  if (pwVar18 != (wchar16 *)0x0) {
    lVar21 = 0;
    do {
      psVar1 = (short *)((long)pwVar18 + lVar21);
      lVar21 = lVar21 + 2;
    } while (*psVar1 != 0);
    if (lVar21 != 2) {
      testUtilFunctions();
      cVar9 = '\0';
    }
  }
  xercesc_4_0::XMLString::release
            ((char **)&local_240,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_1d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar18 = local_264 + 2;
  local_264[2] = L'A';
  local_264[3] = L'\0';
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (aTStack_2a8,pwVar18,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_298 = 0;
  puVar16 = (uchar *)xercesc_4_0::ArrayJanitor<unsigned_char>::release();
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(aTStack_2a8);
  local_248 = puVar16;
  if (puVar16 != (uchar *)"A") {
    if (puVar16 != (uchar *)0x0) {
      lVar21 = 0;
      do {
        puVar3 = puVar16 + lVar21;
        if (*puVar3 == '\0') {
          if ("A"[lVar21] == '\0') goto LAB_0011c7f7;
          break;
        }
        puVar4 = (uchar *)("A" + lVar21);
        lVar21 = lVar21 + 1;
      } while (*puVar3 == *puVar4);
    }
    testUtilFunctions();
    cVar9 = '\0';
  }
LAB_0011c7f7:
  puVar16 = local_248;
  sVar17 = strlen((char *)local_248);
  xercesc_4_0::TranscodeFromStr::TranscodeFromStr
            ((TranscodeFromStr *)aTStack_2a8,puVar16,sVar17,"UTF-8",
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_298 = 0;
  pwVar19 = (wchar16 *)xercesc_4_0::ArrayJanitor<char16_t>::release();
  xercesc_4_0::TranscodeFromStr::~TranscodeFromStr((TranscodeFromStr *)aTStack_2a8);
  local_1e0 = pwVar19;
  if (pwVar19 != pwVar18) {
    if (pwVar19 == (wchar16 *)0x0) {
LAB_0011c86e:
      if (*pwVar18 == L'\0') goto LAB_0011c879;
    }
    else {
      pwVar18 = local_264 + 2;
      do {
        wVar7 = *pwVar19;
        if (wVar7 == L'\0') goto LAB_0011c86e;
        pwVar19 = pwVar19 + 1;
        wVar8 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar7 == wVar8);
    }
    testUtilFunctions();
    cVar9 = '\0';
  }
LAB_0011c879:
  xercesc_4_0::XMLString::release
            ((char **)&local_248,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_1e0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar18 = local_264;
  local_264[0] = L'╋';
  local_264[1] = L'\0';
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (aTStack_2a8,pwVar18,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_298 = 0;
  puVar16 = (uchar *)xercesc_4_0::ArrayJanitor<unsigned_char>::release();
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(aTStack_2a8);
  local_250 = puVar16;
  if (puVar16 != (uchar *)anon_var_dwarf_45c1) {
    if (puVar16 != (uchar *)0x0) {
      lVar21 = 0;
      do {
        puVar3 = puVar16 + lVar21;
        if (*puVar3 == '\0') {
          if (anon_var_dwarf_45c1[lVar21] == '\0') goto LAB_0011c914;
          break;
        }
        puVar4 = (uchar *)(anon_var_dwarf_45c1 + lVar21);
        lVar21 = lVar21 + 1;
      } while (*puVar3 == *puVar4);
    }
    testUtilFunctions();
    cVar9 = '\0';
  }
LAB_0011c914:
  puVar16 = local_250;
  sVar17 = strlen((char *)local_250);
  xercesc_4_0::TranscodeFromStr::TranscodeFromStr
            ((TranscodeFromStr *)aTStack_2a8,puVar16,sVar17,"UTF-8",
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_298 = 0;
  pwVar19 = (wchar16 *)xercesc_4_0::ArrayJanitor<char16_t>::release();
  xercesc_4_0::TranscodeFromStr::~TranscodeFromStr((TranscodeFromStr *)aTStack_2a8);
  local_1e8 = pwVar19;
  if (pwVar19 != pwVar18) {
    if (pwVar19 == (wchar16 *)0x0) {
LAB_0011c98b:
      if (*pwVar18 == L'\0') goto LAB_0011c996;
    }
    else {
      pwVar18 = local_264;
      do {
        wVar7 = *pwVar19;
        if (wVar7 == L'\0') goto LAB_0011c98b;
        pwVar19 = pwVar19 + 1;
        wVar8 = *pwVar18;
        pwVar18 = pwVar18 + 1;
      } while (wVar7 == wVar8);
    }
    testUtilFunctions();
    cVar9 = '\0';
  }
LAB_0011c996:
  xercesc_4_0::XMLString::release
            ((char **)&local_250,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::release(&local_1e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_1cc[0] = L'步';
  local_1cc[1] = L'\0';
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (aTStack_2a8,local_1cc,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_298 = 0;
  pcVar20 = (char *)xercesc_4_0::ArrayJanitor<unsigned_char>::release();
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(aTStack_2a8);
  local_1f0 = pcVar20;
  if (pcVar20 != anon_var_dwarf_45cd) {
    if (pcVar20 != (char *)0x0) {
      lVar21 = 0;
      do {
        pcVar5 = pcVar20 + lVar21;
        if (*pcVar5 == '\0') {
          if (anon_var_dwarf_45cd[lVar21] == '\0') goto LAB_0011ca33;
          break;
        }
        pcVar6 = anon_var_dwarf_45cd + lVar21;
        lVar21 = lVar21 + 1;
      } while (*pcVar5 == *pcVar6);
    }
    testUtilFunctions();
    cVar9 = '\0';
  }
LAB_0011ca33:
  xercesc_4_0::XMLString::release(&local_1f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  builtin_memcpy(local_128,L"絞り込み検索",0xe);
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (aTStack_2a8,local_128,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_298 = 0;
  pcVar20 = (char *)xercesc_4_0::ArrayJanitor<unsigned_char>::release();
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(aTStack_2a8);
  local_1f8 = pcVar20;
  if (pcVar20 != anon_var_dwarf_45d9) {
    if (pcVar20 != (char *)0x0) {
      lVar21 = 0;
      do {
        pcVar5 = pcVar20 + lVar21;
        if (*pcVar5 == '\0') {
          if (anon_var_dwarf_45d9[lVar21] == '\0') goto LAB_0011cad7;
          break;
        }
        pcVar6 = anon_var_dwarf_45d9 + lVar21;
        lVar21 = lVar21 + 1;
      } while (*pcVar5 == *pcVar6);
    }
    testUtilFunctions();
    cVar9 = '\0';
  }
LAB_0011cad7:
  xercesc_4_0::XMLString::release(&local_1f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  builtin_memcpy(local_118,L"中国制造 / 中國製造",0x18);
  xercesc_4_0::TranscodeToStr::TranscodeToStr
            (aTStack_2a8,local_118,"UTF-8",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_298 = 0;
  pcVar20 = (char *)xercesc_4_0::ArrayJanitor<unsigned_char>::release();
  xercesc_4_0::TranscodeToStr::~TranscodeToStr(aTStack_2a8);
  local_200 = pcVar20;
  if (pcVar20 != anon_var_dwarf_45f1) {
    if (pcVar20 != (char *)0x0) {
      lVar21 = 0;
      do {
        pcVar5 = pcVar20 + lVar21;
        if (*pcVar5 == '\0') {
          if (anon_var_dwarf_45f1[lVar21] == '\0') goto LAB_0011cb78;
          break;
        }
        pcVar6 = anon_var_dwarf_45f1 + lVar21;
        lVar21 = lVar21 + 1;
      } while (*pcVar5 == *pcVar6);
    }
    testUtilFunctions();
    cVar9 = '\0';
  }
LAB_0011cb78:
  xercesc_4_0::XMLString::release(&local_200,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::CMStateSet::~CMStateSet(&local_1b0);
  xercesc_4_0::CMStateSet::~CMStateSet(&local_190);
  xercesc_4_0::CMStateSet::~CMStateSet(&local_288);
  xercesc_4_0::CMStateSet::~CMStateSet(&local_220);
  return (bool)cVar9;
}

Assistant:

bool DOMTest::testUtilFunctions()
{
    bool OK = true;
    // test isWSReplaced
    XMLString::transcode(" xyz ", tempStr, 3999);
    TEST_BOOLEAN(XMLString::isWSReplaced(tempStr));
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSReplaced(tempStr));
    XMLString::transcode(" xyz\n", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSReplaced(tempStr));
    XMLString::transcode("\rxyz", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSReplaced(tempStr));

    // test replaceWS
    XMLString::transcode(" x yz ", tempStr2, 3999);
    XMLString::transcode(" x yz ", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" x yz\n", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("\rx yz ", tempStr, 3999);
    XMLString::replaceWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    // test isWSCollapsed
    XMLString::transcode(" xyz ", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode(" xyz\n", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("\rxyz", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("xyz", tempStr, 3999);
    TEST_BOOLEAN(XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("x yz", tempStr, 3999);
    TEST_BOOLEAN(XMLString::isWSCollapsed(tempStr));
    XMLString::transcode("x  yz", tempStr, 3999);
    TEST_BOOLEAN(!XMLString::isWSCollapsed(tempStr));

    // test collapseWS
    XMLString::transcode("x yz", tempStr2, 3999);
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x yz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x  yz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    XMLString::transcode("xyz", tempStr2, 3999);
    XMLString::transcode(" xyz ", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" xyz\n", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("\rxyz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("xyz", tempStr, 3999);
    XMLString::collapseWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    // test removeWS
    XMLString::transcode("xyz", tempStr2, 3999);
    XMLString::transcode(" x\tyz ", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x yz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("x  yz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" xyz ", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode(" xyz\n", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("\rxyz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);
    XMLString::transcode("xyz", tempStr, 3999);
    XMLString::removeWS(tempStr);
    TEST_STRING(tempStr, tempStr2);

    if(XMLString::stringLen((XMLCh*)0)!=0)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::stringLen(XMLUni::fgZeroLenString)!=0)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }
    XMLCh one[2]={ chLatin_A, chNull };
    if(XMLString::stringLen(one)!=1)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }
    XMLCh two[3]={ chLatin_A, chLatin_B, chNull };
    if(XMLString::stringLen(two)!=2)
    {
        fprintf(stderr, "strLen test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test copyNString
    XMLCh buffer[100];
    XMLString::transcode("xyz", tempStr, 3999);
    if(!XMLString::copyNString(buffer, tempStr, 100))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!XMLString::copyNString(buffer, tempStr, 3))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::copyNString(buffer, tempStr, 2))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!XMLString::copyNString(buffer, tempStr, 4))
    {
        fprintf(stderr, "copyNString test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test indexOf
    XMLString::transcode("1234567890", tempStr, 3999);
    if(XMLString::indexOf(tempStr, '1')!=0)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::indexOf(tempStr, '5')!=4)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::indexOf(tempStr, '0')!=9)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::indexOf(tempStr, 'A')!=-1)
    {
        fprintf(stderr, "indexOf test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test lastIndexOf
    XMLString::transcode("1234567890", tempStr, 3999);
    if(XMLString::lastIndexOf(tempStr, '1')!=0)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::lastIndexOf(tempStr, '5')!=4)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::lastIndexOf(tempStr, '0')!=9)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(XMLString::lastIndexOf(tempStr, 'A')!=-1)
    {
        fprintf(stderr, "lastIndexOf test failed at line %i\n", __LINE__);
        OK = false;
    }

    // this tests the cached bit storage
    CMStateSet setT(60);
    setT.setBit(8);
    setT.setBit(52);
    setT.setBit(34);

    if(!setT.getBit(8) || !setT.getBit(52) || !setT.getBit(34))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    CMStateSetEnumerator enumT(&setT);
    if(!enumT.hasMoreElements() || enumT.nextElement()!=8)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!enumT.hasMoreElements() || enumT.nextElement()!=34)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(!enumT.hasMoreElements() || enumT.nextElement()!=52)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    if(enumT.hasMoreElements())
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    // this tests the dynamic bit storage
    CMStateSet setT2(3 * CMSTATE_BITFIELD_CHUNK);
    setT2.setBit(0); // first block, begin
    setT2.setBit(CMSTATE_BITFIELD_CHUNK/2 -1); // first block, middle
    setT2.setBit(CMSTATE_BITFIELD_CHUNK/2); // first block, middle
    setT2.setBit(CMSTATE_BITFIELD_CHUNK/2 +1); // first block, middle
    setT2.setBit(CMSTATE_BITFIELD_CHUNK-1); // first block, end
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK); // last block, begin
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2 -1); // last block, middle
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2); // last block, middle
    setT2.setBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2 +1); // last block, middle
    setT2.setBit(3*CMSTATE_BITFIELD_CHUNK-1); // last block, end

    // test just a few ones
    if(!setT2.getBit(0) || !setT2.getBit(CMSTATE_BITFIELD_CHUNK-1) || !setT2.getBit(2*CMSTATE_BITFIELD_CHUNK + CMSTATE_BITFIELD_CHUNK/2 +1))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    if(setT2.getBitCountInRange(0, 3*CMSTATE_BITFIELD_CHUNK)!=10)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    CMStateSetEnumerator enumT2(&setT2);
    XMLSize_t count=0;
    while(enumT2.hasMoreElements())
    {
        count++;
        enumT2.nextElement();
    }
    if(count!=10)
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    // test the enumerator with a non-default start
    CMStateSetEnumerator enumT2a(&setT2, CMSTATE_BITFIELD_CHUNK/2);
    if(!enumT2a.hasMoreElements() || enumT2a.nextElement()!= (CMSTATE_BITFIELD_CHUNK/2))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    CMStateSetEnumerator enumT2b(&setT2, CMSTATE_BITFIELD_CHUNK/2+2);
    if(!enumT2b.hasMoreElements() || enumT2b.nextElement()!= (CMSTATE_BITFIELD_CHUNK-1))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }
    CMStateSetEnumerator enumT2c(&setT2, 2*CMSTATE_BITFIELD_CHUNK);
    if(!enumT2c.hasMoreElements() || enumT2c.nextElement()!= (2*CMSTATE_BITFIELD_CHUNK))
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

    // this tests the hash generator
    CMStateSet setT3(3 * CMSTATE_BITFIELD_CHUNK), setT4(3 * CMSTATE_BITFIELD_CHUNK);
    // these two sets will have a single bit set at the beginning of a chunk
    setT3.setBit(0);
    setT4.setBit(CMSTATE_BITFIELD_CHUNK);
    if(setT3.hashCode()==setT4.hashCode())
    {
        fprintf(stderr, "bitset test failed at line %i\n", __LINE__);
        OK = false;
    }

	// TranscodeFrom/ToStr

	const char* utf8 = "UTF-8";
	char* empty = (char*)TranscodeToStr(XMLUni::fgZeroLenString,utf8).adopt(); 
	if(XMLString::stringLen(empty)!=0)
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLCh* empty2 = TranscodeFromStr((XMLByte*)empty,strlen(empty),utf8).adopt(); 
	if(XMLString::stringLen(empty2)!=0)
	{
        fprintf(stderr, "TranscodeFromStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&empty);
	XMLString::release(&empty2);

	const XMLCh aval [] = { 0x0041, 0x0000}; //LATIN CAPITAL LETTER A
	char* ac = (char*)TranscodeToStr(aval,utf8).adopt(); 
	if(!XMLString::equals(ac, "A"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLCh* ac2=TranscodeFromStr((XMLByte*)ac, strlen(ac), utf8).adopt();
	if(!XMLString::equals(ac2, aval))
	{
        fprintf(stderr, "TranscodeFromStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&ac);
	XMLString::release(&ac2);
	const XMLCh uval [] = { 0x254B, 0x0000}; //BOX DRAWINGS HEAVY VERTICAL AND HORIZONTAL (needs 3 bytes for utf-8)
	char* uc = (char*)TranscodeToStr(uval,utf8).adopt(); 
	if(!XMLString::equals(uc, "\xE2\x95\x8B"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLCh* uc2=TranscodeFromStr((XMLByte*)uc, strlen(uc), utf8).adopt();
	if(!XMLString::equals(uc2, uval))
	{
        fprintf(stderr, "TranscodeFromStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&uc);
	XMLString::release(&uc2);

	XMLCh uc3[] = { 0x6B65, 0 }; // Unicode Han Character 'step, pace; walk, stroll' (U+6B65); UTF-8 = 0xE6 0xAD 0xA5 (e6ada5)
	char* uc4 = (char*)TranscodeToStr(uc3, utf8).adopt();
	if(!XMLString::equals(uc4, "\xE6\xAD\xA5"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&uc4);

	// Input:                    U+7D5E U+308A U+8FBC U+307F U+691C U+7D22
	// Expected byte sequence:   E7 B5 9E E3 82 8A E8 BE BC E3 81 BF E6 A4 9C E7 B4 A2
	const XMLCh xmlStr [] = { 0x7D5E, 0x308A, 0x8FBC, 0x307F, 0x691C, 0x7D22, 0x0000};
	char* bytes = (char*)TranscodeToStr(xmlStr, "UTF-8").adopt();
	if(!XMLString::equals(bytes, "\xE7\xB5\x9E\xE3\x82\x8A\xE8\xBE\xBC\xE3\x81\xBF\xE6\xA4\x9C\xE7\xB4\xA2"))
	{
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
	}
	XMLString::release(&bytes);

    // XERCESC-2052
    // Input:                    U+4E2D U+56FD U+5236 U+9020 U+4E2D U+570B U+88FD U+9020
    // Expected byte sequence:   E4 B8 AD E5 9B BD E5 88 B6 E9 80 A0 20 2F 20 E4 B8 AD E5 9C 8B E8 A3 BD E9 80 A0
    const XMLCh xmlStr2[] = { 0x4E2D, 0x56FD, 0x5236, 0x9020, 0x20, 0x2F, 0x20, 0x4E2D, 0x570B, 0x88FD, 0x9020, 0x0000 };
    char* bytes2 = (char*)TranscodeToStr(xmlStr2, "UTF-8").adopt();
    if (!XMLString::equals(bytes2, "\xE4\xB8\xAD\xE5\x9B\xBD\xE5\x88\xB6\xE9\x80\xA0\x20\x2F\x20\xE4\xB8\xAD\xE5\x9C\x8B\xE8\xA3\xBD\xE9\x80\xA0"))
    {
        fprintf(stderr, "TranscodeToStr failed at line %i\n", __LINE__);
        OK = false;
    }
    XMLString::release(&bytes2);

    return OK;
}